

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

JavascriptArray * Js::JavascriptNativeFloatArray::ToVarArray(JavascriptNativeFloatArray *fArray)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  ArrayCallSiteInfo *this;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  undefined1 uVar6;
  undefined1 local_f0 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *local_40;
  JavascriptFunction *caller;
  
  walker.currentFrame.stackCheckCodeHeight =
       (size_t)((((((fArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                    super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  uVar6 = ((ThreadContext *)walker.currentFrame.stackCheckCodeHeight)->noJsReentrancy;
  ((ThreadContext *)walker.currentFrame.stackCheckCodeHeight)->noJsReentrancy = true;
  this = JavascriptNativeArray::GetArrayCallSiteInfo(&fArray->super_JavascriptNativeArray);
  if (this != (ArrayCallSiteInfo *)0x0) {
    caller._7_1_ = uVar6;
    JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)local_f0,
               (((((fArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,true,(PVOID)0x0,false);
    local_40 = (JavascriptFunction *)0x0;
    do {
      do {
        BVar3 = JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_f0,&local_40,true);
        uVar6 = caller._7_1_;
        if (BVar3 == 0) {
          bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,NativeArrayConversionPhase);
          if (!bVar2) goto LAB_00a42ba7;
          Output::Print(L"Conversion: Float array to Var array across ScriptContexts");
          goto LAB_00a42ba2;
        }
      } while (local_40 == (JavascriptFunction *)0x0);
      BVar3 = JavascriptFunction::IsScriptFunction(local_40);
      uVar6 = caller._7_1_;
    } while (BVar3 == 0);
    if (local_40 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x930,"(caller)","caller");
      if (!bVar2) goto LAB_00a42c5a;
      *puVar4 = 0;
    }
    pFVar5 = JavascriptFunction::GetFunctionBody(local_40);
    if (pFVar5 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x931,"(caller->GetFunctionBody())","caller->GetFunctionBody()");
      if (!bVar2) goto LAB_00a42c5a;
      *puVar4 = 0;
    }
    pFVar5 = JavascriptFunction::GetFunctionBody(local_40);
    sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
    pFVar5 = JavascriptFunction::GetFunctionBody(local_40);
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar5);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,NativeArrayConversionPhase,sourceContextId,
                              functionId);
    if (bVar2) {
      Output::Print(L"Conversion: Float array to Var array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"
                    ,(ulong)this->functionNumber,(ulong)this->callSiteNumber);
LAB_00a42ba2:
      Output::Flush();
    }
LAB_00a42ba7:
    bVar2 = ScriptContext::IsScriptContextInNonDebugMode
                      ((((((fArray->super_JavascriptNativeArray).super_JavascriptArray.
                           super_ArrayObject.super_DynamicObject.super_RecyclableObject.type.ptr)->
                         javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
    if (bVar2) {
      bVar2 = ArrayCallSiteInfo::IsNativeIntArray(this);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x94a,"(!arrayInfo->IsNativeIntArray())",
                                    "!arrayInfo->IsNativeIntArray()");
        if (!bVar2) {
LAB_00a42c5a:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
    ArrayCallSiteInfo::SetIsNotNativeArray(this);
    JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_f0);
  }
  (fArray->super_JavascriptNativeArray).weakRefToFuncBody.ptr =
       (RecyclerWeakReference<Js::FunctionBody> *)0x0;
  ConvertToVarArray(fArray);
  *(undefined1 *)(walker.currentFrame.stackCheckCodeHeight + 0x108) = uVar6;
  return (JavascriptArray *)fArray;
}

Assistant:

JavascriptArray *JavascriptNativeFloatArray::ToVarArray(JavascriptNativeFloatArray *fArray)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(FloatArr_ToVarArray, reentrancylock, fArray->GetScriptContext()->GetThreadContext());
#if ENABLE_PROFILE_INFO
        ArrayCallSiteInfo *arrayInfo = fArray->GetArrayCallSiteInfo();
        if (arrayInfo)
        {
#if DBG
            Js::JavascriptStackWalker walker(fArray->GetScriptContext());
            Js::JavascriptFunction* caller = nullptr;
            bool foundScriptCaller = false;
            while(walker.GetCaller(&caller))
            {
                if(caller != nullptr && Js::ScriptFunction::Test(caller))
                {
                    foundScriptCaller = true;
                    break;
                }
            }

            if(foundScriptCaller)
            {
                Assert(caller);
                Assert(caller->GetFunctionBody());
                if(PHASE_TRACE(Js::NativeArrayConversionPhase, caller->GetFunctionBody()))
                {
                    Output::Print(_u("Conversion: Float array to Var array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"), arrayInfo->functionNumber, arrayInfo->callSiteNumber);
                    Output::Flush();
                }
            }
            else
            {
                if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
                {
                    Output::Print(_u("Conversion: Float array to Var array across ScriptContexts"));
                    Output::Flush();
                }
            }
#else
            if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
            {
                Output::Print(_u("Conversion: Float array to Var array"));
                Output::Flush();
            }
#endif

            if(fArray->GetScriptContext()->IsScriptContextInNonDebugMode())
            {
                Assert(!arrayInfo->IsNativeIntArray());
            }

            arrayInfo->SetIsNotNativeArray();
        }
#endif

        fArray->ClearArrayCallSiteIndex();

        return ConvertToVarArray(fArray);
        JIT_HELPER_END(FloatArr_ToVarArray);
    }